

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_spy_ImportWriteProtection.cpp
# Opt level: O1

bool axl::spy::disableImportWriteProtection(void *module,ImportWriteProtectionBackup *backup)

{
  int iVar1;
  long lVar2;
  long lVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  size_t __len;
  ulong uVar8;
  void *__addr;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  
  uVar6 = (uint)g::getModule()::module;
  if ((g::getModule()::module == 0) &&
     (uVar6 = __cxa_guard_acquire(&g::getModule()::module), uVar6 != 0)) {
    g::Module::Module((Module *)g::getModule()::module);
    __cxa_atexit(g::Module::~Module,g::getModule()::module,&__dso_handle);
    uVar6 = __cxa_guard_release(&g::getModule()::module);
  }
  bVar4 = (byte)uVar6;
  bVar12 = *(short *)((long)module + 0x2b8) != 0;
  if (bVar12) {
    uVar9 = -g::getModule()::module._8_8_;
    uVar7 = g::getModule()::module._8_8_ - 1;
    lVar10 = 0;
    uVar11 = 0;
    uVar8 = uVar7;
    do {
      lVar2 = *(long *)((long)module + 0x2a8);
      iVar1 = *(int *)(lVar2 + lVar10);
      if (iVar1 == 0x6474e552) {
        uVar8 = *(long *)(lVar2 + 0x10 + lVar10) + *module;
        lVar3 = *(long *)(lVar2 + 0x28 + lVar10);
        __addr = (void *)(uVar8 & uVar9);
        backup->m_p = __addr;
        __len = (lVar3 + uVar7 + uVar8 & uVar9) - (long)__addr;
        backup->m_size = __len;
        backup->field_2 =
             *(anon_union_4_2_2040755a_for_ImportWriteProtectionBackup_2 *)(lVar2 + 4 + lVar10);
        iVar5 = mprotect(__addr,__len,7);
        uVar8 = (ulong)(iVar5 != -1);
      }
      bVar4 = (byte)uVar8;
      if (iVar1 == 0x6474e552) break;
      uVar11 = uVar11 + 1;
      lVar10 = lVar10 + 0x38;
      bVar12 = uVar11 < *(ushort *)((long)module + 0x2b8);
    } while (bVar12);
  }
  if (!bVar12) {
    backup->m_p = (void *)0x0;
    backup->m_size = 0;
    (backup->field_2).m_flags = 0;
    bVar4 = 1;
  }
  return (bool)(bVar4 & 1);
}

Assistant:

bool
disableImportWriteProtection(
	void* module,
	ImportWriteProtectionBackup* backup
) {
	size_t pageSize = g::getModule()->getSystemInfo()->m_pageSize;

	link_map_full* linkMap = (link_map_full*)module;
	for (size_t i = 0; i < linkMap->l_phnum; i++) {
		const ElfW(Phdr)* phdr = &linkMap->l_phdr[i];
		if (phdr->p_type != PT_GNU_RELRO) // read-only-after-relocation (contains GOT)
			continue;

		size_t begin = linkMap->l_addr + phdr->p_vaddr;
		size_t end = begin + phdr->p_memsz;

		begin &= ~(pageSize - 1);
		end = (end + pageSize - 1) & ~(pageSize - 1);

		backup->m_p = (char*)begin;
		backup->m_size = end - begin;
		backup->m_flags = phdr->p_flags;

		int result = ::mprotect(backup->m_p, backup->m_size, PROT_READ | PROT_WRITE | PROT_EXEC);
		return result != -1;
	}

	// GOT not found, still OK

	backup->m_p = NULL;
	backup->m_size = 0;
	backup->m_flags = 0;
	return true;
}